

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash *
Internal_VertexHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                   ON_SubDVertex *first_vertex,uint level_index,ON_SubDVertexIdIterator *vidit)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *local_b8;
  ON_SubDVertex *v;
  undefined1 local_a8 [4];
  uint prev_id;
  ON_SHA1 sha1;
  ON_SubDVertexIdIterator *vidit_local;
  uint level_index_local;
  ON_SubDVertex *first_vertex_local;
  ON_SubDHashType hash_type_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = vidit;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_a8);
  if (hash_type != Unset) {
    v._4_4_ = 0;
    for (local_b8 = first_vertex; local_b8 != (ON_SubDVertex *)0x0;
        local_b8 = local_b8->m_next_vertex) {
      if ((local_b8->super_ON_SubDComponentBase).m_id < v._4_4_) {
        ON_SHA1::Reset((ON_SHA1 *)local_a8);
        local_b8 = ON_SubDVertexIdIterator::FirstVertex
                             ((ON_SubDVertexIdIterator *)sha1.m_sha1_hash.m_digest._12_8_);
        while (local_b8 != (ON_SubDVertex *)0x0) {
          uVar2 = ON_SubDComponentBase::SubdivisionLevel(&local_b8->super_ON_SubDComponentBase);
          if ((level_index == uVar2) &&
             (bVar1 = ON_SubDComponentBase::IsActive(&local_b8->super_ON_SubDComponentBase), bVar1))
          {
            Internal_AccumulateVertexHash((ON_SHA1 *)local_a8,hash_type,local_b8);
          }
          local_b8 = ON_SubDVertexIdIterator::NextVertex
                               ((ON_SubDVertexIdIterator *)sha1.m_sha1_hash.m_digest._12_8_);
        }
        break;
      }
      Internal_AccumulateVertexHash((ON_SHA1 *)local_a8,hash_type,local_b8);
      v._4_4_ = (local_b8->super_ON_SubDComponentBase).m_id;
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_VertexHash(ON_SubDHashType hash_type, const ON_SubDVertex* first_vertex, unsigned int level_index, ON_SubDVertexIdIterator& vidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDVertex* v = first_vertex; nullptr != v; v = v->m_next_vertex)
    {
      if (prev_id > v->m_id)
      {
        // must use slower vidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (v = vidit.FirstVertex(); nullptr != v; v = vidit.NextVertex())
        {
          if ( level_index == v->SubdivisionLevel() && v->IsActive() )
            Internal_AccumulateVertexHash(sha1, hash_type, v);
        }
        break;
      }
      Internal_AccumulateVertexHash(sha1, hash_type, v);
      prev_id = v->m_id;
    }
  }
  return sha1.Hash();
}